

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O0

bool __thiscall FIX::TimeRange::isInSameRange(TimeRange *this,DateTime *time1,DateTime *time2)

{
  DateTime *time2_local;
  DateTime *time1_local;
  TimeRange *this_local;
  
  if ((*(int *)(this + 0x30) < 0) && (*(int *)(this + 0x34) < 0)) {
    this_local._7_1_ = isInSameRange((UtcTimeOnly *)this,(UtcTimeOnly *)(this + 0x18),time1,time2);
  }
  else {
    this_local._7_1_ =
         isInSameRange((UtcTimeOnly *)this,(UtcTimeOnly *)(this + 0x18),*(int *)(this + 0x30),
                       *(int *)(this + 0x34),time1,time2);
  }
  return this_local._7_1_;
}

Assistant:

bool isInSameRange(const DateTime &time1, const DateTime &time2) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInSameRange(m_startTime, m_endTime, time1, time2);
    } else {
      return isInSameRange(m_startTime, m_endTime, m_startDay, m_endDay, time1, time2);
    }
  }